

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  ulong *iEnd;
  ulong *puVar1;
  ulong *puVar2;
  int *piVar3;
  ulong *puVar4;
  undefined8 *puVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  bool bVar10;
  uint uVar11;
  undefined8 uVar12;
  char cVar13;
  char cVar14;
  int iVar15;
  uint uVar16;
  size_t sVar17;
  ulong *puVar18;
  ulong *puVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  U32 UVar23;
  uint uVar24;
  uint uVar25;
  ulong *puVar26;
  ulong uVar27;
  BYTE *pBVar28;
  uint uVar29;
  uint uVar30;
  ulong *puVar31;
  ulong uVar32;
  BYTE *pBVar33;
  uint uVar34;
  ulong uVar35;
  BYTE *pBVar36;
  uint uVar37;
  ulong uVar38;
  ulong *puVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  seqDef *psVar43;
  U32 UVar44;
  int iVar45;
  ulong *puVar46;
  ulong uVar47;
  ulong uVar48;
  ulong *puVar49;
  BYTE *litEnd;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  ulong *local_110;
  seqDef *local_f8;
  uint local_e8;
  ulong *local_e0;
  
  pUVar6 = ms->hashTable;
  iEnd = (ulong *)((long)src + srcSize);
  pBVar7 = (ms->window).base;
  iVar45 = (int)pBVar7;
  iVar15 = (int)iEnd - iVar45;
  uVar30 = (ms->window).lowLimit;
  uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar11 = uVar30;
  if (uVar34 < iVar15 - uVar30) {
    uVar11 = iVar15 - uVar34;
  }
  if (ms->loadedDictEnd != 0) {
    uVar11 = uVar30;
  }
  pUVar8 = ms->chainTable;
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  uVar30 = (ms->window).dictLimit;
  uVar37 = *rep;
  uVar25 = rep[1];
  cVar13 = (char)(ms->cParams).hashLog;
  cVar14 = (char)(ms->cParams).chainLog;
  local_110 = (ulong *)src;
  if (uVar11 < uVar30) {
    psVar43 = (seqDef *)src;
    if (src < puVar4) {
      pBVar9 = (ms->window).dictBase;
      puVar1 = (ulong *)(pBVar7 + uVar30);
      puVar31 = (ulong *)(pBVar9 + uVar11);
      puVar2 = (ulong *)(pBVar9 + uVar30);
      bVar20 = 0x20 - cVar14;
      bVar21 = 0x40 - cVar13;
      puVar19 = iEnd + -4;
      uVar34 = mls - 5;
      uVar32 = (ulong)uVar34;
      local_f8 = (seqDef *)src;
LAB_0015205f:
      if (uVar34 < 4) {
        sVar17 = (*(code *)(&DAT_0019f3a8 + *(int *)(&DAT_0019f3a8 + uVar32 * 4)))();
        return sVar17;
      }
      uVar29 = (uint)((int)*local_110 * -0x61c8864f) >> (bVar20 & 0x1f);
      uVar47 = *local_110;
      uVar16 = pUVar8[uVar29];
      pBVar28 = pBVar7;
      if (uVar16 < uVar30) {
        pBVar28 = pBVar9;
      }
      uVar35 = uVar47 * -0x30e44323485a9b9d >> (bVar21 & 0x3f);
      uVar42 = pUVar6[uVar35];
      pBVar33 = pBVar7;
      if (uVar42 < uVar30) {
        pBVar33 = pBVar9;
      }
      UVar44 = (int)local_110 - iVar45;
      UVar23 = UVar44 + 1;
      pUVar6[uVar35] = UVar44;
      uVar24 = UVar23 - uVar37;
      pUVar8[uVar29] = UVar44;
      pBVar36 = pBVar7;
      if (uVar24 < uVar30) {
        pBVar36 = pBVar9;
      }
      if (((uVar11 < uVar24) && (2 < (uVar30 - 1) - uVar24)) &&
         (*(int *)(pBVar36 + uVar24) == *(int *)((long)local_110 + 1))) {
        puVar46 = iEnd;
        if (uVar24 < uVar30) {
          puVar46 = puVar2;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)local_110 + 5),(BYTE *)((long)(pBVar36 + uVar24) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar46,(BYTE *)puVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00153dae;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00153d8f;
        puVar46 = (ulong *)((long)local_110 + 1);
        uVar47 = (long)puVar46 - (long)local_f8;
        puVar26 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar26 + uVar47))
        goto LAB_00153d51;
        if (iEnd < puVar46) goto LAB_00153d70;
        if (puVar19 < puVar46) {
          ZSTD_safecopyLiterals((BYTE *)puVar26,(BYTE *)local_f8,(BYTE *)puVar46,(BYTE *)puVar19);
LAB_00152239:
          seqStore->lit = seqStore->lit + uVar47;
          if (0xffff < uVar47) {
            if (seqStore->longLengthID != 0) goto LAB_00153dec;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar35 = *(ulong *)(local_f8 + 1);
          *puVar26 = *(ulong *)local_f8;
          puVar26[1] = uVar35;
          pBVar28 = seqStore->lit;
          if (0x10 < uVar47) {
            lVar40 = (long)(pBVar28 + 0x10) - (long)(local_f8 + 2);
            if (lVar40 < 8) {
              if (-0x10 < lVar40) goto LAB_00153e0b;
            }
            else if (0xffffffffffffffe0 < lVar40 - 0x10U) goto LAB_00153e2a;
            uVar35 = *(ulong *)(local_f8 + 3);
            *(ulong *)(pBVar28 + 0x10) = *(ulong *)(local_f8 + 2);
            *(ulong *)(pBVar28 + 0x18) = uVar35;
            if (0x20 < (long)uVar47) {
              lVar40 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_f8 + lVar40 + 0x20);
                uVar12 = puVar5[1];
                pBVar33 = pBVar28 + lVar40 + 0x20;
                *(undefined8 *)pBVar33 = *puVar5;
                *(undefined8 *)(pBVar33 + 8) = uVar12;
                puVar5 = (undefined8 *)((long)local_f8 + lVar40 + 0x30);
                uVar12 = puVar5[1];
                *(undefined8 *)(pBVar33 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar33 + 0x18) = uVar12;
                lVar40 = lVar40 + 0x20;
              } while (pBVar33 + 0x20 < pBVar28 + uVar47);
            }
            goto LAB_00152239;
          }
          seqStore->lit = pBVar28 + uVar47;
        }
        lVar40 = sVar17 + 4;
        uVar35 = sVar17 + 1;
        local_f8 = seqStore->sequences;
        local_f8->litLength = (U16)uVar47;
        local_f8->offset = 1;
        uVar42 = uVar37;
        if (0xffff < uVar35) {
          if (seqStore->longLengthID != 0) goto LAB_00153dcd;
LAB_00152937:
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)local_f8 - (long)seqStore->sequencesStart) >> 3);
        }
LAB_00152958:
        psVar43 = (seqDef *)(lVar40 + (long)puVar46);
        local_f8->matchLength = (U16)uVar35;
        local_f8 = local_f8 + 1;
        seqStore->sequences = local_f8;
        uVar37 = uVar42;
        local_110 = (ulong *)psVar43;
        if (psVar43 <= puVar4) {
          uVar37 = UVar44 + 2;
          pUVar6[(ulong)(*(long *)(pBVar7 + uVar37) * -0x30e44323485a9b9d) >> (bVar21 & 0x3f)] =
               uVar37;
          pUVar6[(ulong)(*(long *)((long)psVar43 + -2) * -0x30e44323485a9b9d) >> (bVar21 & 0x3f)] =
               ((int)psVar43 + -2) - iVar45;
          if (uVar34 < 4) {
            sVar17 = (*(code *)(&DAT_0019f3b8 + *(int *)(&DAT_0019f3b8 + uVar32 * 4)))();
            return sVar17;
          }
          pUVar8[(uint)(*(int *)(pBVar7 + uVar37) * -0x61c8864f) >> (bVar20 & 0x1f)] = uVar37;
          pUVar8[(uint)(*(int *)((long)psVar43 + -1) * -0x61c8864f) >> (bVar20 & 0x1f)] =
               ((int)psVar43 + -1) - iVar45;
          do {
            uVar29 = uVar42;
            UVar23 = (int)psVar43 - iVar45;
            uVar16 = UVar23 - uVar25;
            pBVar28 = pBVar7;
            if (uVar16 < uVar30) {
              pBVar28 = pBVar9;
            }
            uVar37 = uVar29;
            local_110 = (ulong *)psVar43;
            if (((uVar16 <= uVar11) || ((uVar30 - 1) - uVar16 < 3)) ||
               (*(int *)(pBVar28 + uVar16) != (int)*(ulong *)psVar43)) break;
            puVar46 = iEnd;
            if (uVar16 < uVar30) {
              puVar46 = puVar2;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)psVar43 + 4),(BYTE *)((long)(pBVar28 + uVar16) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar46,(BYTE *)puVar1);
            if (seqStore->maxNbSeq <= (ulong)((long)local_f8 - (long)seqStore->sequencesStart >> 3))
            goto LAB_00153dae;
            if (0x20000 < seqStore->maxNbLit) goto LAB_00153d8f;
            puVar46 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar46) goto LAB_00153d51;
            if (iEnd < psVar43) goto LAB_00153d70;
            if (puVar19 < psVar43) {
              ZSTD_safecopyLiterals((BYTE *)puVar46,(BYTE *)psVar43,(BYTE *)psVar43,(BYTE *)puVar19)
              ;
            }
            else {
              uVar47 = ((ulong *)psVar43)[1];
              *puVar46 = *(ulong *)psVar43;
              puVar46[1] = uVar47;
            }
            local_f8 = seqStore->sequences;
            local_f8->litLength = 0;
            local_f8->offset = 1;
            if (0xffff < sVar17 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_00153dcd;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)local_f8 - (long)seqStore->sequencesStart) >> 3);
            }
            local_f8->matchLength = (U16)(sVar17 + 1);
            local_f8 = local_f8 + 1;
            seqStore->sequences = local_f8;
            if (uVar34 < 4) {
              sVar17 = (*(code *)(&DAT_0019f3c8 + *(int *)(&DAT_0019f3c8 + uVar32 * 4)))();
              return sVar17;
            }
            uVar47 = *(ulong *)psVar43;
            pUVar8[(uint)((int)*(ulong *)psVar43 * -0x61c8864f) >> (bVar20 & 0x1f)] = UVar23;
            pUVar6[uVar47 * -0x30e44323485a9b9d >> (bVar21 & 0x3f)] = UVar23;
            psVar43 = (seqDef *)((long)psVar43 + sVar17 + 4);
            uVar42 = uVar25;
            uVar37 = uVar25;
            local_110 = (ulong *)psVar43;
            uVar25 = uVar29;
          } while (psVar43 <= puVar4);
        }
LAB_00152ccb:
        local_f8 = psVar43;
        if (puVar4 <= local_110) goto LAB_00153d2a;
        goto LAB_0015205f;
      }
      puVar46 = local_110;
      if ((uVar11 < uVar42) && (puVar26 = (ulong *)(pBVar33 + uVar42), *puVar26 == uVar47)) {
        puVar39 = puVar1;
        puVar18 = iEnd;
        if (uVar42 < uVar30) {
          puVar39 = puVar31;
          puVar18 = puVar2;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)(local_110 + 1),(BYTE *)(puVar26 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar18,(BYTE *)puVar1);
        lVar40 = sVar17 + 8;
        if ((puVar39 < puVar26) && (local_f8 < local_110)) {
          puVar26 = (ulong *)(pBVar33 + uVar42);
          do {
            puVar26 = (ulong *)((long)puVar26 + -1);
            puVar18 = (ulong *)((long)local_110 + -1);
            puVar46 = local_110;
            if ((*(BYTE *)puVar18 != *(BYTE *)puVar26) ||
               (lVar40 = lVar40 + 1, puVar46 = puVar18, puVar26 <= puVar39)) break;
            local_110 = puVar18;
          } while (local_f8 < puVar18);
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00153dae;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00153d8f;
        uVar47 = (long)puVar46 - (long)local_f8;
        puVar26 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar26 + uVar47))
        goto LAB_00153d51;
        if (iEnd < puVar46) goto LAB_00153d70;
        if (puVar19 < puVar46) {
          ZSTD_safecopyLiterals((BYTE *)puVar26,(BYTE *)local_f8,(BYTE *)puVar46,(BYTE *)puVar19);
LAB_00152679:
          seqStore->lit = seqStore->lit + uVar47;
          if (0xffff < uVar47) {
            if (seqStore->longLengthID != 0) goto LAB_00153dec;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar35 = *(ulong *)(local_f8 + 1);
          *puVar26 = *(ulong *)local_f8;
          puVar26[1] = uVar35;
          pBVar28 = seqStore->lit;
          if (0x10 < uVar47) {
            lVar41 = (long)(pBVar28 + 0x10) - (long)(local_f8 + 2);
            if (lVar41 < 8) {
              if (-0x10 < lVar41) goto LAB_00153e0b;
            }
            else if (0xffffffffffffffe0 < lVar41 - 0x10U) goto LAB_00153e2a;
            uVar35 = *(ulong *)(local_f8 + 3);
            *(ulong *)(pBVar28 + 0x10) = *(ulong *)(local_f8 + 2);
            *(ulong *)(pBVar28 + 0x18) = uVar35;
            if (0x20 < (long)uVar47) {
              lVar41 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_f8 + lVar41 + 0x20);
                uVar12 = puVar5[1];
                pBVar33 = pBVar28 + lVar41 + 0x20;
                *(undefined8 *)pBVar33 = *puVar5;
                *(undefined8 *)(pBVar33 + 8) = uVar12;
                puVar5 = (undefined8 *)((long)local_f8 + lVar41 + 0x30);
                uVar12 = puVar5[1];
                *(undefined8 *)(pBVar33 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar33 + 0x18) = uVar12;
                lVar41 = lVar41 + 0x20;
              } while (pBVar33 + 0x20 < pBVar28 + uVar47);
            }
            goto LAB_00152679;
          }
          seqStore->lit = pBVar28 + uVar47;
        }
        uVar42 = UVar44 - uVar42;
      }
      else {
        if ((uVar16 <= uVar11) ||
           (puVar26 = (ulong *)(pBVar28 + uVar16), (int)*puVar26 != (int)*local_110)) {
          psVar43 = local_f8;
          local_110 = (ulong *)((long)local_110 + ((long)local_110 - (long)local_f8 >> 8) + 1);
          goto LAB_00152ccb;
        }
        uVar47 = *(ulong *)((long)local_110 + 1);
        uVar35 = uVar47 * -0x30e44323485a9b9d >> (bVar21 & 0x3f);
        uVar25 = pUVar6[uVar35];
        pBVar33 = pBVar7;
        if (uVar25 < uVar30) {
          pBVar33 = pBVar9;
        }
        pUVar6[uVar35] = UVar23;
        if ((uVar11 < uVar25) && (puVar18 = (ulong *)(pBVar33 + uVar25), *puVar18 == uVar47)) {
          puVar46 = (ulong *)((long)local_110 + 1);
          puVar39 = puVar1;
          puVar26 = iEnd;
          if (uVar25 < uVar30) {
            puVar39 = puVar31;
            puVar26 = puVar2;
          }
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)((long)local_110 + 9),(BYTE *)(puVar18 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar26,(BYTE *)puVar1);
          lVar40 = sVar17 + 8;
          uVar42 = UVar23 - uVar25;
          if ((puVar39 < puVar18) && (local_f8 < puVar46)) {
            puVar26 = (ulong *)(pBVar33 + ((ulong)uVar25 - 1));
            do {
              puVar46 = local_110;
              if ((BYTE)*puVar46 != (BYTE)*puVar26) goto LAB_0015259d;
              lVar40 = lVar40 + 1;
            } while ((puVar39 < puVar26) &&
                    (puVar26 = (ulong *)((long)puVar26 + -1),
                    local_110 = (ulong *)((long)puVar46 + -1), local_f8 < puVar46));
          }
        }
        else {
          puVar39 = puVar1;
          puVar18 = iEnd;
          if (uVar16 < uVar30) {
            puVar39 = puVar31;
            puVar18 = puVar2;
          }
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)((long)local_110 + 4),(BYTE *)((long)puVar26 + 4),(BYTE *)iEnd
                              ,(BYTE *)puVar18,(BYTE *)puVar1);
          lVar40 = sVar17 + 4;
          uVar42 = UVar44 - uVar16;
          if ((puVar39 < puVar26) && (local_f8 < local_110)) {
            puVar18 = (ulong *)(pBVar28 + uVar16);
            puVar26 = (ulong *)((long)local_110 + -1);
            do {
              puVar18 = (ulong *)((long)puVar18 + -1);
              if ((BYTE)*puVar26 != *(BYTE *)puVar18) {
                puVar46 = (ulong *)((long)puVar26 + 1);
                goto LAB_001527e6;
              }
              lVar40 = lVar40 + 1;
              puVar46 = (ulong *)((long)puVar26 + -1);
            } while ((puVar39 < puVar18) && (bVar10 = local_f8 < puVar26, puVar26 = puVar46, bVar10)
                    );
LAB_0015259d:
            puVar46 = (ulong *)((long)puVar46 + 1);
          }
        }
LAB_001527e6:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00153dae;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00153d8f;
        uVar47 = (long)puVar46 - (long)local_f8;
        puVar26 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar26 + uVar47))
        goto LAB_00153d51;
        if (iEnd < puVar46) goto LAB_00153d70;
        if (puVar19 < puVar46) {
          ZSTD_safecopyLiterals((BYTE *)puVar26,(BYTE *)local_f8,(BYTE *)puVar46,(BYTE *)puVar19);
LAB_00152863:
          seqStore->lit = seqStore->lit + uVar47;
          if (uVar47 < 0x10000) goto LAB_00152909;
          if (seqStore->longLengthID != 0) goto LAB_00153dec;
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        else {
          uVar35 = *(ulong *)(local_f8 + 1);
          *puVar26 = *(ulong *)local_f8;
          puVar26[1] = uVar35;
          pBVar28 = seqStore->lit;
          if (0x10 < uVar47) {
            lVar41 = (long)(pBVar28 + 0x10) - (long)(local_f8 + 2);
            if (lVar41 < 8) {
              if (-0x10 < lVar41) goto LAB_00153e0b;
            }
            else if (0xffffffffffffffe0 < lVar41 - 0x10U) goto LAB_00153e2a;
            uVar35 = *(ulong *)(local_f8 + 3);
            *(ulong *)(pBVar28 + 0x10) = *(ulong *)(local_f8 + 2);
            *(ulong *)(pBVar28 + 0x18) = uVar35;
            if (0x20 < (long)uVar47) {
              lVar41 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_f8 + lVar41 + 0x20);
                uVar12 = puVar5[1];
                pBVar33 = pBVar28 + lVar41 + 0x20;
                *(undefined8 *)pBVar33 = *puVar5;
                *(undefined8 *)(pBVar33 + 8) = uVar12;
                puVar5 = (undefined8 *)((long)local_f8 + lVar41 + 0x30);
                uVar12 = puVar5[1];
                *(undefined8 *)(pBVar33 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar33 + 0x18) = uVar12;
                lVar41 = lVar41 + 0x20;
              } while (pBVar33 + 0x20 < pBVar28 + uVar47);
            }
            goto LAB_00152863;
          }
          seqStore->lit = pBVar28 + uVar47;
        }
      }
LAB_00152909:
      uVar35 = lVar40 - 3;
      local_f8 = seqStore->sequences;
      local_f8->litLength = (U16)uVar47;
      local_f8->offset = uVar42 + 3;
      uVar25 = uVar37;
      if (uVar35 < 0x10000) goto LAB_00152958;
      if (seqStore->longLengthID == 0) goto LAB_00152937;
      goto LAB_00153dcd;
    }
LAB_00153d2a:
    local_110 = (ulong *)psVar43;
    *rep = uVar37;
  }
  else {
    uVar11 = iVar15 - uVar34;
    if (iVar15 - uVar30 <= uVar34) {
      uVar11 = uVar30;
    }
    pBVar9 = pBVar7 + uVar11;
    puVar19 = (ulong *)((ulong)((int)src == (int)pBVar9) + (long)src);
    uVar34 = (int)puVar19 - (int)pBVar9;
    local_e8 = uVar25;
    uVar30 = 0;
    if (uVar34 < uVar25) {
      local_e8 = 0;
      uVar30 = uVar25;
    }
    if (uVar34 < uVar37) {
      uVar30 = uVar37;
    }
    uVar32 = (ulong)uVar37;
    if (uVar34 < uVar37) {
      uVar32 = 0;
    }
    if (puVar19 < puVar4) {
      bVar20 = 0x40 - cVar13;
      bVar21 = 0x40 - cVar14;
      bVar22 = 0x20 - cVar14;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar31 = (ulong *)((long)iEnd - 1);
      puVar46 = iEnd + -4;
LAB_00152e57:
      uVar34 = (uint)uVar32;
      uVar47 = *puVar19;
      uVar38 = uVar47 * -0x30e44323485a9b9d;
      uVar35 = uVar38 >> (bVar20 & 0x3f);
      iVar15 = mls - 5;
      switch(iVar15) {
      case 0:
        lVar40 = -0x30e4432345000000;
        break;
      case 1:
        lVar40 = -0x30e4432340650000;
        break;
      case 2:
        lVar40 = -0x30e44323405a9d00;
        break;
      case 3:
        goto switchD_00152ea2_caseD_3;
      default:
        uVar38 = (ulong)((uint)((int)uVar47 * -0x61c8864f) >> (bVar22 & 0x1f));
        goto LAB_00152ee7;
      }
      uVar38 = lVar40 * uVar47;
switchD_00152ea2_caseD_3:
      uVar38 = uVar38 >> (bVar21 & 0x3f);
LAB_00152ee7:
      UVar23 = (int)puVar19 - iVar45;
      uVar37 = pUVar6[uVar35];
      uVar27 = (ulong)uVar37;
      uVar25 = pUVar8[uVar38];
      uVar48 = (ulong)uVar25;
      pUVar8[uVar38] = UVar23;
      pUVar6[uVar35] = UVar23;
      local_e0 = (ulong *)((long)puVar19 + 1);
      if ((uVar34 == 0) || (*(int *)((long)local_e0 - uVar32) != *(int *)((long)puVar19 + 1))) {
        if ((uVar11 < uVar37) && (puVar26 = (ulong *)(pBVar7 + uVar27), *puVar26 == uVar47)) {
          puVar18 = puVar19 + 1;
          puVar39 = puVar26 + 1;
          puVar49 = puVar18;
          if (puVar18 < puVar1) {
            if (*puVar39 == *puVar18) {
              lVar40 = 0;
              do {
                puVar39 = (ulong *)((long)puVar19 + lVar40 + 0x10);
                if (puVar1 <= puVar39) {
                  puVar39 = (ulong *)(pBVar7 + lVar40 + uVar27 + 0x10);
                  puVar49 = (ulong *)((long)puVar19 + lVar40 + 0x10);
                  goto LAB_00153477;
                }
                lVar41 = lVar40 + uVar27 + 0x10;
                uVar32 = *puVar39;
                lVar40 = lVar40 + 8;
              } while (*(ulong *)(pBVar7 + lVar41) == uVar32);
              uVar32 = uVar32 ^ *(ulong *)(pBVar7 + lVar41);
              uVar47 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              uVar32 = (uVar47 >> 3 & 0x1fffffff) + lVar40;
            }
            else {
              uVar47 = *puVar18 ^ *puVar39;
              uVar32 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar32 = uVar32 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00153477:
            if ((puVar49 < puVar2) && ((int)*puVar39 == (int)*puVar49)) {
              puVar49 = (ulong *)((long)puVar49 + 4);
              puVar39 = (ulong *)((long)puVar39 + 4);
            }
            if ((puVar49 < puVar31) && ((short)*puVar39 == (short)*puVar49)) {
              puVar49 = (ulong *)((long)puVar49 + 2);
              puVar39 = (ulong *)((long)puVar39 + 2);
            }
            if (puVar49 < iEnd) {
              puVar49 = (ulong *)((long)puVar49 + (ulong)((BYTE)*puVar39 == (BYTE)*puVar49));
            }
            uVar32 = (long)puVar49 - (long)puVar18;
          }
          lVar40 = uVar32 + 8;
          uVar32 = (long)puVar19 - (long)puVar26;
          local_e0 = puVar19;
          if (local_110 < puVar19) {
            pBVar28 = pBVar7 + (uVar27 - 1);
            puVar19 = (ulong *)((long)puVar19 + -1);
            do {
              if ((BYTE)*puVar19 != *pBVar28) goto LAB_001536a0;
              lVar40 = lVar40 + 1;
              puVar26 = (ulong *)((long)puVar19 + -1);
            } while ((pBVar9 < pBVar28) &&
                    (pBVar28 = pBVar28 + -1, bVar10 = local_110 < puVar19, puVar19 = puVar26, bVar10
                    ));
            goto LAB_0015369b;
          }
          goto LAB_001536a6;
        }
        if ((uVar11 < uVar25) && (piVar3 = (int *)(pBVar7 + uVar48), *piVar3 == (int)*puVar19)) {
          uVar32 = *local_e0;
          uVar35 = uVar32 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          uVar37 = pUVar6[uVar35];
          uVar47 = (ulong)uVar37;
          pUVar6[uVar35] = UVar23 + 1;
          if ((uVar11 < uVar37) && (puVar26 = (ulong *)(pBVar7 + uVar47), *puVar26 == uVar32)) {
            puVar18 = (ulong *)((long)puVar19 + 9);
            puVar39 = puVar26 + 1;
            puVar49 = puVar18;
            if (puVar18 < puVar1) {
              if (*puVar39 == *puVar18) {
                lVar40 = 0;
                do {
                  puVar39 = (ulong *)((long)puVar19 + lVar40 + 0x11);
                  if (puVar1 <= puVar39) {
                    puVar39 = (ulong *)(pBVar7 + lVar40 + uVar47 + 0x10);
                    puVar49 = (ulong *)((long)puVar19 + lVar40 + 0x11);
                    goto LAB_00153611;
                  }
                  lVar41 = lVar40 + uVar47 + 0x10;
                  uVar32 = *puVar39;
                  lVar40 = lVar40 + 8;
                } while (*(ulong *)(pBVar7 + lVar41) == uVar32);
                uVar32 = uVar32 ^ *(ulong *)(pBVar7 + lVar41);
                uVar35 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar32 = (uVar35 >> 3 & 0x1fffffff) + lVar40;
              }
              else {
                uVar35 = *puVar18 ^ *puVar39;
                uVar32 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00153611:
              if ((puVar49 < puVar2) && ((int)*puVar39 == (int)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 4);
                puVar39 = (ulong *)((long)puVar39 + 4);
              }
              if ((puVar49 < puVar31) && ((short)*puVar39 == (short)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 2);
                puVar39 = (ulong *)((long)puVar39 + 2);
              }
              if (puVar49 < iEnd) {
                puVar49 = (ulong *)((long)puVar49 + (ulong)((BYTE)*puVar39 == (BYTE)*puVar49));
              }
              uVar32 = (long)puVar49 - (long)puVar18;
            }
            lVar40 = uVar32 + 8;
            uVar32 = (long)local_e0 - (long)puVar26;
            if (local_110 < local_e0) {
              pBVar28 = pBVar7 + (uVar47 - 1);
              do {
                if ((BYTE)*puVar19 != *pBVar28) goto LAB_001536a0;
                lVar40 = lVar40 + 1;
                puVar26 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar9 < pBVar28) &&
                      (pBVar28 = pBVar28 + -1, bVar10 = local_110 < puVar19, puVar19 = puVar26,
                      bVar10));
LAB_0015369b:
              local_e0 = (ulong *)((long)puVar26 + 1);
            }
          }
          else {
            puVar26 = (ulong *)((long)puVar19 + 4);
            puVar18 = (ulong *)(piVar3 + 1);
            puVar39 = puVar26;
            if (puVar26 < puVar1) {
              if (*puVar18 == *puVar26) {
                lVar40 = 0;
                do {
                  puVar18 = (ulong *)((long)puVar19 + lVar40 + 0xc);
                  if (puVar1 <= puVar18) {
                    puVar18 = (ulong *)(pBVar7 + lVar40 + uVar48 + 0xc);
                    puVar39 = (ulong *)((long)puVar19 + lVar40 + 0xc);
                    goto LAB_00153541;
                  }
                  lVar41 = lVar40 + uVar48 + 0xc;
                  uVar32 = *puVar18;
                  lVar40 = lVar40 + 8;
                } while (*(ulong *)(pBVar7 + lVar41) == uVar32);
                uVar32 = uVar32 ^ *(ulong *)(pBVar7 + lVar41);
                uVar47 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                uVar32 = (uVar47 >> 3 & 0x1fffffff) + lVar40;
              }
              else {
                uVar47 = *puVar26 ^ *puVar18;
                uVar32 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00153541:
              if ((puVar39 < puVar2) && ((int)*puVar18 == (int)*puVar39)) {
                puVar39 = (ulong *)((long)puVar39 + 4);
                puVar18 = (ulong *)((long)puVar18 + 4);
              }
              if ((puVar39 < puVar31) && ((short)*puVar18 == (short)*puVar39)) {
                puVar39 = (ulong *)((long)puVar39 + 2);
                puVar18 = (ulong *)((long)puVar18 + 2);
              }
              if (puVar39 < iEnd) {
                puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar18 == (BYTE)*puVar39));
              }
              uVar32 = (long)puVar39 - (long)puVar26;
            }
            lVar40 = uVar32 + 4;
            uVar32 = (long)puVar19 - (long)piVar3;
            local_e0 = puVar19;
            if (local_110 < puVar19) {
              pBVar28 = pBVar7 + (uVar48 - 1);
              puVar19 = (ulong *)((long)puVar19 + -1);
              do {
                if ((BYTE)*puVar19 != *pBVar28) goto LAB_001536a0;
                lVar40 = lVar40 + 1;
                puVar26 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar9 < pBVar28) &&
                      (pBVar28 = pBVar28 + -1, bVar10 = local_110 < puVar19, puVar19 = puVar26,
                      bVar10));
              goto LAB_0015369b;
            }
          }
          goto LAB_001536a6;
        }
        puVar19 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)local_110 >> 8) + 1);
        goto LAB_00153c47;
      }
      lVar40 = -uVar32;
      puVar26 = (ulong *)((long)puVar19 + 5);
      puVar39 = (ulong *)((long)puVar19 + lVar40 + 5);
      puVar18 = puVar26;
      if (puVar26 < puVar1) {
        if (*puVar39 == *puVar26) {
          lVar41 = 0;
          do {
            puVar18 = (ulong *)((long)puVar19 + lVar41 + 0xd);
            if (puVar1 <= puVar18) {
              puVar39 = (ulong *)((long)puVar19 + lVar40 + lVar41 + 0xd);
              puVar18 = (ulong *)((long)puVar19 + lVar41 + 0xd);
              goto LAB_00153215;
            }
            uVar47 = *(ulong *)((long)puVar19 + lVar41 + lVar40 + 0xd);
            uVar35 = *puVar18;
            lVar41 = lVar41 + 8;
          } while (uVar47 == uVar35);
          uVar35 = uVar35 ^ uVar47;
          uVar47 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
            }
          }
          uVar35 = (uVar47 >> 3 & 0x1fffffff) + lVar41;
        }
        else {
          uVar35 = *puVar26 ^ *puVar39;
          uVar47 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
            }
          }
          uVar35 = uVar47 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00153215:
        if ((puVar18 < puVar2) && ((int)*puVar39 == (int)*puVar18)) {
          puVar18 = (ulong *)((long)puVar18 + 4);
          puVar39 = (ulong *)((long)puVar39 + 4);
        }
        if ((puVar18 < puVar31) && ((short)*puVar39 == (short)*puVar18)) {
          puVar18 = (ulong *)((long)puVar18 + 2);
          puVar39 = (ulong *)((long)puVar39 + 2);
        }
        if (puVar18 < iEnd) {
          puVar18 = (ulong *)((long)puVar18 + (ulong)((BYTE)*puVar39 == (BYTE)*puVar18));
        }
        uVar35 = (long)puVar18 - (long)puVar26;
      }
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar47 = (long)local_e0 - (long)local_110;
          puVar19 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar19 + uVar47) <= seqStore->litStart + seqStore->maxNbLit) {
            if (local_e0 <= iEnd) {
              if (puVar46 < local_e0) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar19,(BYTE *)local_110,(BYTE *)local_e0,(BYTE *)puVar46);
LAB_001532e4:
                seqStore->lit = seqStore->lit + uVar47;
                if (0xffff < uVar47) {
                  if (seqStore->longLengthID != 0) {
LAB_00153dec:
                    __assert_fail("seqStorePtr->longLengthID == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x204d,
                                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                 );
                  }
                  seqStore->longLengthID = 1;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
              }
              else {
                uVar38 = local_110[1];
                *puVar19 = *local_110;
                puVar19[1] = uVar38;
                pBVar28 = seqStore->lit;
                if (0x10 < uVar47) {
                  lVar40 = (long)(pBVar28 + 0x10) - (long)(local_110 + 2);
                  if (lVar40 < 8) {
                    if (-0x10 < lVar40) {
LAB_00153e0b:
                      __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x1268,
                                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                   );
                    }
                  }
                  else if (0xffffffffffffffe0 < lVar40 - 0x10U) {
LAB_00153e2a:
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1270,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar38 = local_110[3];
                  *(ulong *)(pBVar28 + 0x10) = local_110[2];
                  *(ulong *)(pBVar28 + 0x18) = uVar38;
                  if (0x20 < (long)uVar47) {
                    lVar40 = 0;
                    do {
                      puVar5 = (undefined8 *)((long)local_110 + lVar40 + 0x20);
                      uVar12 = puVar5[1];
                      pBVar33 = pBVar28 + lVar40 + 0x20;
                      *(undefined8 *)pBVar33 = *puVar5;
                      *(undefined8 *)(pBVar33 + 8) = uVar12;
                      puVar5 = (undefined8 *)((long)local_110 + lVar40 + 0x30);
                      uVar12 = puVar5[1];
                      *(undefined8 *)(pBVar33 + 0x10) = *puVar5;
                      *(undefined8 *)(pBVar33 + 0x18) = uVar12;
                      lVar40 = lVar40 + 0x20;
                    } while (pBVar33 + 0x20 < pBVar28 + uVar47);
                  }
                  goto LAB_001532e4;
                }
                seqStore->lit = pBVar28 + uVar47;
              }
              lVar40 = uVar35 + 4;
              uVar35 = uVar35 + 1;
              psVar43 = seqStore->sequences;
              psVar43->litLength = (U16)uVar47;
              psVar43->offset = 1;
              uVar34 = local_e8;
              if (uVar35 < 0x10000) goto LAB_00153810;
              if (seqStore->longLengthID == 0) goto LAB_001537f4;
              goto LAB_00153dcd;
            }
LAB_00153d70:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
LAB_00153d51:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
LAB_00153d8f:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
LAB_00153dae:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar34 = (uint)uVar32;
LAB_00153cfa:
    if (uVar34 == 0) {
      uVar34 = uVar30;
    }
    *rep = uVar34;
    uVar25 = local_e8;
    if (local_e8 == 0) {
      uVar25 = uVar30;
    }
  }
  rep[1] = uVar25;
  return (long)iEnd - (long)local_110;
LAB_001536a0:
  local_e0 = (ulong *)((long)puVar19 + 1);
LAB_001536a6:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00153dae;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00153d8f;
  uVar47 = (long)local_e0 - (long)local_110;
  puVar19 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar47)) goto LAB_00153d51;
  if (iEnd < local_e0) goto LAB_00153d70;
  if (puVar46 < local_e0) {
    ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)local_110,(BYTE *)local_e0,(BYTE *)puVar46);
LAB_0015372e:
    seqStore->lit = seqStore->lit + uVar47;
    if (0xffff < uVar47) {
      if (seqStore->longLengthID != 0) goto LAB_00153dec;
      seqStore->longLengthID = 1;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar35 = local_110[1];
    *puVar19 = *local_110;
    puVar19[1] = uVar35;
    pBVar28 = seqStore->lit;
    if (0x10 < uVar47) {
      lVar41 = (long)(pBVar28 + 0x10) - (long)(local_110 + 2);
      if (lVar41 < 8) {
        if (-0x10 < lVar41) goto LAB_00153e0b;
      }
      else if (0xffffffffffffffe0 < lVar41 - 0x10U) goto LAB_00153e2a;
      uVar35 = local_110[3];
      *(ulong *)(pBVar28 + 0x10) = local_110[2];
      *(ulong *)(pBVar28 + 0x18) = uVar35;
      if (0x20 < (long)uVar47) {
        lVar41 = 0;
        do {
          puVar5 = (undefined8 *)((long)local_110 + lVar41 + 0x20);
          uVar12 = puVar5[1];
          pBVar33 = pBVar28 + lVar41 + 0x20;
          *(undefined8 *)pBVar33 = *puVar5;
          *(undefined8 *)(pBVar33 + 8) = uVar12;
          puVar5 = (undefined8 *)((long)local_110 + lVar41 + 0x30);
          uVar12 = puVar5[1];
          *(undefined8 *)(pBVar33 + 0x10) = *puVar5;
          *(undefined8 *)(pBVar33 + 0x18) = uVar12;
          lVar41 = lVar41 + 0x20;
        } while (pBVar33 + 0x20 < pBVar28 + uVar47);
      }
      goto LAB_0015372e;
    }
    seqStore->lit = pBVar28 + uVar47;
  }
  uVar35 = lVar40 - 3;
  psVar43 = seqStore->sequences;
  psVar43->litLength = (U16)uVar47;
  psVar43->offset = (int)uVar32 + 3;
  if (0xffff < uVar35) {
    uVar32 = uVar32 & 0xffffffff;
    if (seqStore->longLengthID != 0) {
LAB_00153dcd:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2058,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
LAB_001537f4:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00153810:
  puVar19 = (ulong *)(lVar40 + (long)local_e0);
  psVar43->matchLength = (U16)uVar35;
  psVar43 = psVar43 + 1;
  seqStore->sequences = psVar43;
  local_110 = puVar19;
  if (puVar4 < puVar19) {
    uVar32 = uVar32 & 0xffffffff;
    local_e8 = uVar34;
    goto LAB_00153c47;
  }
  uVar37 = UVar23 + 2;
  lVar40 = *(long *)(pBVar7 + uVar37);
  uVar47 = lVar40 * -0x30e44323485a9b9d;
  pUVar6[uVar47 >> (bVar20 & 0x3f)] = uVar37;
  pUVar6[(ulong)(*(long *)((long)puVar19 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
       ((int)puVar19 + -2) - iVar45;
  switch(iVar15) {
  case 0:
    lVar41 = -0x30e4432345000000;
    break;
  case 1:
    lVar41 = -0x30e4432340650000;
    break;
  case 2:
    lVar41 = -0x30e44323405a9d00;
    break;
  case 3:
    pUVar8[uVar47 >> (bVar21 & 0x3f)] = uVar37;
    uVar47 = *(long *)((long)puVar19 + -1) * -0x30e44323485a9b9d;
    goto LAB_00153944;
  default:
    pUVar8[(uint)(*(int *)(pBVar7 + uVar37) * -0x61c8864f) >> (bVar22 & 0x1f)] = uVar37;
    uVar47 = (ulong)((uint)(*(int *)((long)puVar19 + -1) * -0x61c8864f) >> (bVar22 & 0x1f));
    goto LAB_00153947;
  }
  pUVar8[(ulong)(lVar40 * lVar41) >> (bVar21 & 0x3f)] = uVar37;
  uVar47 = lVar41 * *(long *)((long)puVar19 + -1);
LAB_00153944:
  uVar47 = uVar47 >> (bVar21 & 0x3f);
LAB_00153947:
  pUVar8[uVar47] = ((int)puVar19 + -1) - iVar45;
  uVar47 = uVar32;
  do {
    uVar32 = (ulong)uVar34;
    local_e8 = (uint)uVar47;
    if ((uVar34 == 0) || ((int)*local_110 != *(int *)((long)local_110 - uVar32))) {
      uVar32 = uVar47 & 0xffffffff;
      puVar19 = local_110;
      local_e8 = uVar34;
      break;
    }
    lVar40 = -uVar32;
    puVar19 = (ulong *)((long)local_110 + 4);
    puVar18 = (ulong *)((long)local_110 + lVar40 + 4);
    puVar26 = puVar19;
    if (puVar19 < puVar1) {
      if (*puVar18 == *puVar19) {
        lVar41 = 0;
        do {
          puVar26 = (ulong *)((long)local_110 + lVar41 + 0xc);
          if (puVar1 <= puVar26) {
            puVar18 = (ulong *)((long)local_110 + lVar40 + lVar41 + 0xc);
            puVar26 = (ulong *)((long)local_110 + lVar41 + 0xc);
            goto LAB_00153a47;
          }
          uVar47 = *(ulong *)((long)local_110 + lVar41 + lVar40 + 0xc);
          uVar35 = *puVar26;
          lVar41 = lVar41 + 8;
        } while (uVar47 == uVar35);
        uVar35 = uVar35 ^ uVar47;
        uVar47 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
          }
        }
        uVar47 = (uVar47 >> 3 & 0x1fffffff) + lVar41;
      }
      else {
        uVar35 = *puVar19 ^ *puVar18;
        uVar47 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
          }
        }
        uVar47 = uVar47 >> 3 & 0x1fffffff;
      }
    }
    else {
LAB_00153a47:
      if ((puVar26 < puVar2) && ((int)*puVar18 == (int)*puVar26)) {
        puVar26 = (ulong *)((long)puVar26 + 4);
        puVar18 = (ulong *)((long)puVar18 + 4);
      }
      if ((puVar26 < puVar31) && ((short)*puVar18 == (short)*puVar26)) {
        puVar26 = (ulong *)((long)puVar26 + 2);
        puVar18 = (ulong *)((long)puVar18 + 2);
      }
      if (puVar26 < iEnd) {
        puVar26 = (ulong *)((long)puVar26 + (ulong)((BYTE)*puVar18 == (BYTE)*puVar26));
      }
      uVar47 = (long)puVar26 - (long)puVar19;
    }
    switch(iVar15) {
    case 0:
      uVar35 = *local_110;
      lVar40 = -0x30e4432345000000;
      break;
    case 1:
      uVar35 = *local_110;
      lVar40 = -0x30e4432340650000;
      break;
    case 2:
      uVar35 = *local_110;
      lVar40 = -0x30e44323405a9d00;
      break;
    case 3:
      uVar35 = *local_110;
      uVar38 = uVar35 * -0x30e44323485a9b9d;
      goto LAB_00153af1;
    default:
      uVar38 = (ulong)((uint)((int)*local_110 * -0x61c8864f) >> (bVar22 & 0x1f));
      uVar35 = *local_110;
      goto LAB_00153af9;
    }
    uVar38 = lVar40 * uVar35;
LAB_00153af1:
    uVar38 = uVar38 >> (bVar21 & 0x3f);
LAB_00153af9:
    UVar23 = (int)local_110 - iVar45;
    pUVar8[uVar38] = UVar23;
    pUVar6[uVar35 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar23;
    if (seqStore->maxNbSeq <= (ulong)((long)psVar43 - (long)seqStore->sequencesStart >> 3))
    goto LAB_00153dae;
    if (0x20000 < seqStore->maxNbLit) goto LAB_00153d8f;
    puVar19 = (ulong *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < puVar19) goto LAB_00153d51;
    if (iEnd < local_110) goto LAB_00153d70;
    if (puVar46 < local_110) {
      ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)local_110,(BYTE *)local_110,(BYTE *)puVar46);
    }
    else {
      uVar35 = local_110[1];
      *puVar19 = *local_110;
      puVar19[1] = uVar35;
    }
    psVar43 = seqStore->sequences;
    psVar43->litLength = 0;
    psVar43->offset = 1;
    if (0xffff < uVar47 + 1) {
      if (seqStore->longLengthID != 0) goto LAB_00153dcd;
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar43->matchLength = (U16)(uVar47 + 1);
    psVar43 = psVar43 + 1;
    seqStore->sequences = psVar43;
    puVar19 = (ulong *)((long)local_110 + uVar47 + 4);
    uVar47 = uVar32;
    uVar34 = local_e8;
    local_110 = puVar19;
  } while (puVar19 <= puVar4);
LAB_00153c47:
  uVar34 = (uint)uVar32;
  if (puVar4 <= puVar19) goto LAB_00153cfa;
  goto LAB_00152e57;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, mls, ZSTD_noDict);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 current = (U32)(ip-base);
        const U32 repIndex = current + 1 - offset_1;   /* offset_1 expected <= current +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = current;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (repIndex > dictStartIndex))
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = current - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = current + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = current+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = current - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = current+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (repIndex2 > dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}